

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type wasm::Type::getLeastUpperBound(Type a,Type b)

{
  Type a_00;
  bool bVar1;
  pointer pTVar2;
  pointer pTVar3;
  Type *pTVar4;
  HeapType *pHVar5;
  optional<wasm::HeapType> oVar6;
  Exactness local_f8;
  Exactness local_f4;
  Exactness local_f0;
  bool local_ea;
  Exactness exactness;
  Nullability nullability;
  _Storage<wasm::HeapType,_true> local_a0;
  optional<wasm::HeapType> heapType;
  HeapType heapTypeB;
  HeapType heapTypeA;
  Type local_68;
  Type lub;
  size_t i;
  undefined1 local_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  size_t size;
  Type local_20;
  Type b_local;
  Type a_local;
  
  local_20.id = b.id;
  b_local = a;
  bVar1 = operator==(&b_local,&local_20);
  if (bVar1) {
    a_local = b_local;
  }
  else {
    size._4_4_ = 1;
    bVar1 = operator==(&b_local,(BasicType *)((long)&size + 4));
    if (bVar1) {
      a_local.id = local_20.id;
    }
    else {
      size._0_4_ = 1;
      bVar1 = operator==(&local_20,(BasicType *)&size);
      if (bVar1) {
        a_local = b_local;
      }
      else {
        bVar1 = isTuple(&b_local);
        if ((bVar1) && (bVar1 = isTuple(&local_20), bVar1)) {
          pTVar2 = (pointer)Type::size(&b_local);
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pTVar2;
          pTVar3 = (pointer)Type::size(&local_20);
          if (pTVar2 == pTVar3) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,
                       (size_type)
                       elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
            for (lub.id = 0;
                lub.id < elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage; lub.id = lub.id + 1) {
              pTVar4 = operator[](&b_local,lub.id);
              a_00.id = pTVar4->id;
              pTVar4 = operator[](&local_20,lub.id);
              local_68 = getLeastUpperBound(a_00,pTVar4->id);
              heapTypeA.id._4_4_ = 0;
              bVar1 = operator==(&local_68,(BasicType *)((long)&heapTypeA.id + 4));
              if (bVar1) {
                Type(&a_local,none);
                goto LAB_02673966;
              }
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,&local_68);
            }
            Type(&a_local,(Tuple *)local_48);
LAB_02673966:
            heapTypeA.id._0_4_ = 1;
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
          }
          else {
            Type(&a_local,none);
          }
        }
        else {
          bVar1 = isRef(&b_local);
          if ((bVar1) && (bVar1 = isRef(&local_20), bVar1)) {
            heapTypeB = getHeapType(&b_local);
            heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = getHeapType(&local_20);
            oVar6 = HeapType::getLeastUpperBound
                              (heapTypeB,
                               (HeapType)
                               heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_8_);
            local_a0 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
            heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
                 oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_engaged;
            bVar1 = std::optional::operator_cast_to_bool((optional *)&local_a0._M_value);
            if (bVar1) {
              bVar1 = isNullable(&b_local);
              local_ea = true;
              if (!bVar1) {
                local_ea = isNullable(&local_20);
              }
              bVar1 = HeapType::isBottom(&heapTypeB);
              if (bVar1) {
                local_f0 = getExactness(&local_20);
              }
              else {
                bVar1 = HeapType::isBottom((HeapType *)
                                           &heapType.
                                            super__Optional_base<wasm::HeapType,_true,_true>.
                                            _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                            _M_engaged);
                if (bVar1) {
                  local_f4 = getExactness(&b_local);
                }
                else {
                  bVar1 = isInexact(&b_local);
                  if ((bVar1) || (bVar1 = isInexact(&local_20), bVar1)) {
                    local_f8 = Inexact;
                  }
                  else {
                    bVar1 = HeapType::operator!=
                                      (&heapTypeB,
                                       (HeapType *)
                                       &heapType.super__Optional_base<wasm::HeapType,_true,_true>.
                                        _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                        _M_engaged);
                    local_f8 = (Exactness)!bVar1;
                  }
                  local_f4 = local_f8;
                }
                local_f0 = local_f4;
              }
              pHVar5 = std::optional<wasm::HeapType>::operator*
                                 ((optional<wasm::HeapType> *)&local_a0._M_value);
              Type(&a_local,(HeapType)pHVar5->id,(uint)(local_ea != false),local_f0);
              return (Type)a_local.id;
            }
          }
          Type(&a_local,none);
        }
      }
    }
  }
  return (Type)a_local.id;
}

Assistant:

Type Type::getLeastUpperBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a == Type::unreachable) {
    return b;
  }
  if (b == Type::unreachable) {
    return a;
  }
  if (a.isTuple() && b.isTuple()) {
    auto size = a.size();
    if (size != b.size()) {
      return Type::none;
    }
    std::vector<Type> elems;
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto lub = Type::getLeastUpperBound(a[i], b[i]);
      if (lub == Type::none) {
        return Type::none;
      }
      elems.push_back(lub);
    }
    return Type(elems);
  }
  if (a.isRef() && b.isRef()) {
    auto heapTypeA = a.getHeapType();
    auto heapTypeB = b.getHeapType();
    if (auto heapType = HeapType::getLeastUpperBound(heapTypeA, heapTypeB)) {
      auto nullability =
        (a.isNullable() || b.isNullable()) ? Nullable : NonNullable;
      // If one heap type is bottom, then the exactness comes from the other
      // heap type. Otherwise, the LUB can only be exact if both of the inputs
      // are the same exact heap type.
      auto exactness = heapTypeA.isBottom()               ? b.getExactness()
                       : heapTypeB.isBottom()             ? a.getExactness()
                       : (a.isInexact() || b.isInexact()) ? Inexact
                       : (heapTypeA != heapTypeB)         ? Inexact
                                                          : Exact;
      return Type(*heapType, nullability, exactness);
    }
  }
  return Type::none;
  WASM_UNREACHABLE("unexpected type");
}